

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O0

double alex::fanout_tree::merge_nodes_upwards<int,int>
                 (int start_level,double best_cost,int num_keys,int total_keys,
                 vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                 *fanout_tree)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  reference pvVar7;
  reference pvVar8;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  *in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  double in_XMM0_Qa;
  double merging_cost_saving;
  int num_right_keys;
  int num_left_keys;
  int num_node_keys;
  int i;
  bool at_least_one_merge;
  int level_fanout;
  int level;
  int local_30;
  int local_24;
  double local_10;
  
  local_24 = in_EDI;
  local_10 = in_XMM0_Qa;
  while( true ) {
    if (local_24 < 1) {
      return local_10;
    }
    bVar6 = false;
    for (local_30 = 0; local_30 < (1 << ((byte)local_24 & 0x1f)) / 2; local_30 = local_30 + 1) {
      pvVar7 = std::
               vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
               ::operator[](in_RCX,(long)local_24);
      pvVar8 = std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
               operator[](pvVar7,(long)(local_30 << 1));
      if ((pvVar8->use & 1U) != 0) {
        pvVar7 = std::
                 vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                 ::operator[](in_RCX,(long)local_24);
        pvVar8 = std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 ::operator[](pvVar7,(long)(local_30 * 2 + 1));
        if ((pvVar8->use & 1U) != 0) {
          pvVar7 = std::
                   vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                   ::operator[](in_RCX,(long)(local_24 + -1));
          pvVar8 = std::
                   vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
                   operator[](pvVar7,(long)local_30);
          iVar3 = pvVar8->num_keys;
          if (iVar3 == 0) {
            pvVar7 = std::
                     vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                     ::operator[](in_RCX,(long)local_24);
            pvVar8 = std::
                     vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
                     operator[](pvVar7,(long)(local_30 << 1));
            pvVar8->use = false;
            pvVar7 = std::
                     vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                     ::operator[](in_RCX,(long)local_24);
            pvVar8 = std::
                     vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
                     operator[](pvVar7,(long)(local_30 * 2 + 1));
            pvVar8->use = false;
            pvVar7 = std::
                     vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                     ::operator[](in_RCX,(long)(local_24 + -1));
            pvVar8 = std::
                     vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
                     operator[](pvVar7,(long)local_30);
            pvVar8->use = true;
            bVar6 = true;
            local_10 = local_10 - ((double)in_EDX * 9.999999999999999e-05) / (double)in_ESI;
          }
          else {
            pvVar7 = std::
                     vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                     ::operator[](in_RCX,(long)local_24);
            pvVar8 = std::
                     vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
                     operator[](pvVar7,(long)(local_30 << 1));
            iVar4 = pvVar8->num_keys;
            pvVar7 = std::
                     vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                     ::operator[](in_RCX,(long)local_24);
            pvVar8 = std::
                     vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
                     operator[](pvVar7,(long)(local_30 * 2 + 1));
            iVar5 = pvVar8->num_keys;
            pvVar7 = std::
                     vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                     ::operator[](in_RCX,(long)local_24);
            pvVar8 = std::
                     vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
                     operator[](pvVar7,(long)(local_30 << 1));
            dVar1 = pvVar8->cost;
            pvVar7 = std::
                     vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                     ::operator[](in_RCX,(long)local_24);
            pvVar8 = std::
                     vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
                     operator[](pvVar7,(long)(local_30 * 2 + 1));
            dVar2 = pvVar8->cost;
            pvVar7 = std::
                     vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                     ::operator[](in_RCX,(long)(local_24 + -1));
            pvVar8 = std::
                     vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
                     operator[](pvVar7,(long)local_30);
            dVar1 = (((dVar1 * (double)iVar4) / (double)iVar3 +
                     (dVar2 * (double)iVar5) / (double)iVar3) - pvVar8->cost) +
                    ((double)in_EDX * 9.999999999999999e-05) / (double)iVar3;
            if (0.0 <= dVar1) {
              pvVar7 = std::
                       vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                       ::operator[](in_RCX,(long)local_24);
              pvVar8 = std::
                       vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                       ::operator[](pvVar7,(long)(local_30 << 1));
              pvVar8->use = false;
              pvVar7 = std::
                       vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                       ::operator[](in_RCX,(long)local_24);
              pvVar8 = std::
                       vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                       ::operator[](pvVar7,(long)(local_30 * 2 + 1));
              pvVar8->use = false;
              pvVar7 = std::
                       vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                       ::operator[](in_RCX,(long)(local_24 + -1));
              pvVar8 = std::
                       vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                       ::operator[](pvVar7,(long)local_30);
              pvVar8->use = true;
              local_10 = local_10 - (dVar1 * (double)iVar3) / (double)in_ESI;
              bVar6 = true;
            }
          }
        }
      }
    }
    if (!bVar6) break;
    local_24 = local_24 + -1;
  }
  return local_10;
}

Assistant:

static double merge_nodes_upwards(
    int start_level, double best_cost, int num_keys, int total_keys,
    std::vector<std::vector<FTNode>>& fanout_tree) {
  for (int level = start_level; level >= 1; level--) {
    int level_fanout = 1 << level;
    bool at_least_one_merge = false;
    for (int i = 0; i < level_fanout / 2; i++) {
      if (fanout_tree[level][2 * i].use && fanout_tree[level][2 * i + 1].use) {
        int num_node_keys = fanout_tree[level - 1][i].num_keys;
        if (num_node_keys == 0) {
          fanout_tree[level][2 * i].use = false;
          fanout_tree[level][2 * i + 1].use = false;
          fanout_tree[level - 1][i].use = true;
          at_least_one_merge = true;
          best_cost -= kModelSizeWeight * sizeof(AlexDataNode<T, P>) *
                       total_keys / num_keys;
          continue;
        }
        int num_left_keys = fanout_tree[level][2 * i].num_keys;
        int num_right_keys = fanout_tree[level][2 * i + 1].num_keys;
        double merging_cost_saving =
            (fanout_tree[level][2 * i].cost * num_left_keys / num_node_keys) +
            (fanout_tree[level][2 * i + 1].cost * num_right_keys /
             num_node_keys) -
            fanout_tree[level - 1][i].cost +
            (kModelSizeWeight * sizeof(AlexDataNode<T, P>) * total_keys /
             num_node_keys);
        if (merging_cost_saving >= 0) {
          fanout_tree[level][2 * i].use = false;
          fanout_tree[level][2 * i + 1].use = false;
          fanout_tree[level - 1][i].use = true;
          best_cost -= merging_cost_saving * num_node_keys / num_keys;
          at_least_one_merge = true;
        }
      }
    }
    if (!at_least_one_merge) {
      break;
    }
  }
  return best_cost;
}